

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O0

ChFrameMoving<double> * __thiscall
chrono::ChFrameMoving<double>::operator>>
          (ChFrameMoving<double> *__return_storage_ptr__,ChFrameMoving<double> *this,
          ChFrameMoving<double> *Fb)

{
  ChQuaternion<double> local_60;
  ChVector<double> local_40;
  undefined1 local_21;
  ChFrameMoving<double> *local_20;
  ChFrameMoving<double> *Fb_local;
  ChFrameMoving<double> *this_local;
  ChFrameMoving<double> *res;
  
  local_21 = 0;
  local_20 = Fb;
  Fb_local = this;
  this_local = __return_storage_ptr__;
  ChVector<double>::ChVector(&local_40,0.0,0.0,0.0);
  ChQuaternion<double>::ChQuaternion(&local_60,1.0,0.0,0.0,0.0);
  ChFrameMoving(__return_storage_ptr__,&local_40,&local_60);
  TransformLocalToParent(local_20,this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ChFrameMoving<Real> operator>>(const ChFrameMoving<Real>& Fb) const {
        ChFrameMoving<Real> res;
        Fb.TransformLocalToParent(*this, res);
        return res;
    }